

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

xmlErrorPtr xmlCtxtGetLastError(void *ctx)

{
  xmlParserCtxtPtr ctxt;
  void *ctx_local;
  
  if (ctx == (void *)0x0) {
    ctx_local = (void *)0x0;
  }
  else if (*(int *)((long)ctx + 0x25c) == 0) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = (void *)((long)ctx + 600);
  }
  return (xmlErrorPtr)ctx_local;
}

Assistant:

xmlErrorPtr
xmlCtxtGetLastError(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    if (ctxt == NULL)
        return (NULL);
    if (ctxt->lastError.code == XML_ERR_OK)
        return (NULL);
    return (&ctxt->lastError);
}